

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O1

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::drop_subscription_for_all_states
          (storage_t *this,mbox_t *mbox,type_index *msg_type)

{
  abstract_message_box_t *paVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var5;
  agent_t *paVar6;
  const_iterator __position;
  _Rb_tree_header *p_Var7;
  _Self __tmp;
  _Base_ptr p_Var8;
  key_t local_48;
  
  iVar3 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  iVar4 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  local_48.m_mbox_id = CONCAT44(extraout_var_00,iVar4);
  local_48.m_msg_type = (type_index)msg_type->_M_target;
  local_48.m_state = (state_t *)0x0;
  p_Var8 = (this->m_events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &(this->m_events)._M_t._M_impl.super__Rb_tree_header;
  __position._M_node = &p_Var7->_M_header;
  if (p_Var8 != (_Base_ptr)0x0) {
    do {
      bVar2 = key_t::operator<((key_t *)(p_Var8 + 1),&local_48);
      if (!bVar2) {
        __position._M_node = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[bVar2];
    } while (p_Var8 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)__position._M_node != p_Var7) &&
     (CONCAT44(extraout_var,iVar3) == *(long *)(__position._M_node + 1))) {
    bVar2 = std::type_index::operator==(msg_type,(type_index *)&__position._M_node[1]._M_parent);
    if (bVar2) {
      do {
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
        ::_M_erase_aux(&(this->m_events)._M_t,__position);
        if (((_Rb_tree_header *)p_Var5 == p_Var7) ||
           (CONCAT44(extraout_var,iVar3) != *(long *)(p_Var5 + 1))) break;
        bVar2 = std::type_index::operator==(msg_type,(type_index *)&p_Var5[1]._M_parent);
        __position._M_node = p_Var5;
      } while (bVar2);
      paVar1 = mbox->m_obj;
      paVar6 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (*paVar1->_vptr_abstract_message_box_t[4])(paVar1,msg_type,paVar6);
    }
  }
  return;
}

Assistant:

void
storage_t::drop_subscription_for_all_states(
	const mbox_t & mbox,
	const std::type_index & msg_type )
	{
		const is_same_mbox_msg is_same{ mbox->id(), msg_type };

		auto lower_bound = m_events.lower_bound(
				key_t{ mbox->id(), msg_type, nullptr } );

		auto need_erase = [&] {
				return lower_bound != std::end(m_events) &&
						is_same( lower_bound->first );
			};
		const bool events_found = need_erase();

		if( events_found )
			{
				do
					{
						m_events.erase( lower_bound++ );
					}
				while( need_erase() );

				// Note: since v.5.5.9 mbox unsubscription is initiated even if
				// it is MPSC mboxes. It is important for the case of message
				// delivery tracing.

				mbox->unsubscribe_event_handlers( msg_type, owner() );
			}
	}